

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O3

bool bgp_update_handle_path_attribute
               (bgp_peer *peer,uchar *buff,uint16_t unfeasible_routes_length,
               uint16_t total_path_attribute_length,adj_ribs_in_data *route_data)

{
  byte bVar1;
  ushort uVar2;
  in_addr __in;
  bool bVar3;
  uchar *puVar4;
  uint uVar5;
  undefined6 in_register_0000000a;
  int iVar6;
  undefined6 in_register_00000012;
  char **args_1;
  int iVar7;
  char *pcVar8;
  log_level level;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  uint8_t segment_type;
  uint8_t segment_length;
  uint8_t type;
  string as_list_str;
  uint8_t origin;
  undefined1 local_21b [3];
  adj_ribs_in_data *local_218;
  int local_210;
  uint local_20c;
  char *local_208;
  undefined8 local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  long *local_1e8;
  long local_1d8 [2];
  uchar *local_1c8;
  uint local_1bc;
  bgp_peer *local_1b8;
  uchar *local_1b0;
  char *local_1a8 [14];
  ios_base local_138 [264];
  
  iVar7 = (int)CONCAT62(in_register_0000000a,total_path_attribute_length);
  if (iVar7 != 0) {
    iVar6 = (int)CONCAT62(in_register_00000012,unfeasible_routes_length);
    iVar10 = iVar6 + 0x17;
    iVar7 = iVar6 + iVar7 + 0x17;
    local_1b0 = buff + 2;
    local_218 = route_data;
    local_210 = iVar7;
    local_1c8 = buff;
    local_1b8 = peer;
    do {
      puVar4 = local_1c8;
      args_1 = local_1a8;
      local_21b[2] = buff[(long)iVar10 + 1];
      if ((buff[iVar10] & 0x10) == 0) {
        local_20c = (uint)buff[(long)iVar10 + 2];
        iVar6 = 3;
      }
      else {
        local_20c = (uint)(ushort)(*(ushort *)(buff + (long)iVar10 + 2) << 8 |
                                  *(ushort *)(buff + (long)iVar10 + 2) >> 8);
        iVar6 = 4;
      }
      iVar10 = iVar10 + iVar6;
      switch(local_21b[2]) {
      case '\x01':
        local_1a8[0] = (char *)CONCAT71(local_1a8[0]._1_7_,buff[iVar10]);
        (local_218->path_attr).origin = buff[iVar10];
        level = INFO;
        pcVar8 = "Origin %d";
        goto LAB_00112335;
      case '\x02':
        local_21b[0] = buff[iVar10];
        local_21b[1] = buff[(long)iVar10 + 1];
        if (local_21b[0] != '\x02') {
          level = DEBUG;
          pcVar8 = "Unable to interpret segment type %d";
          args_1 = (char **)local_21b;
          goto LAB_00112335;
        }
        local_208 = &local_1f8;
        local_200 = 0;
        local_1f8 = '\0';
        if (local_21b[1] != 0) {
          uVar11 = 0;
          bVar3 = false;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__cxx11::string::append((char *)&local_208);
            if (local_1b8->is_4_octet_as_supported == true) {
              uVar5 = *(uint *)(puVar4 + uVar11 * 4 + (long)(iVar10 + 2));
              uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18;
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              bVar1 = (local_218->path_attr).as_path_length;
            }
            else {
              uVar2 = *(ushort *)(puVar4 + uVar11 * 2 + (long)(iVar10 + 2));
              uVar5 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              bVar1 = (local_218->path_attr).as_path_length;
            }
            bVar9 = true;
            if (bVar1 < 0x40) {
              (local_218->path_attr).as_path_length = bVar1 + 1;
              (local_218->path_attr).as_path[bVar1] = uVar5;
              bVar9 = bVar3;
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
            if (local_1e8 != local_1d8) {
              operator_delete(local_1e8,local_1d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            iVar7 = local_210;
            uVar11 = uVar11 + 1;
            bVar3 = bVar9;
          } while (uVar11 < local_21b[1]);
          if (bVar9) {
            log<unsigned_char>(WARNING,"Overflowed AS PATH %d",local_21b + 1);
          }
        }
        local_1a8[0] = local_208;
        log<char_const*>(INFO,"AS Path%s",local_1a8);
        buff = local_1c8;
        if (local_208 != &local_1f8) {
LAB_001123f4:
          buff = local_1c8;
          operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
        }
        break;
      case '\x03':
        if ((short)local_20c != 4) {
          __assert_fail("attribute_len == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/kametan0730[P]my_awesome_bgp/bgp.cpp"
                        ,0x138,
                        "bool bgp_update_handle_path_attribute(bgp_peer *, const unsigned char *, uint16_t, uint16_t, adj_ribs_in_data &)"
                       );
        }
        __in.s_addr = *(in_addr_t *)(buff + iVar10);
        (local_218->path_attr).next_hop =
             __in.s_addr >> 0x18 | (__in.s_addr & 0xff0000) >> 8 | (__in.s_addr & 0xff00) << 8 |
             __in.s_addr << 0x18;
        local_1a8[0] = inet_ntoa(__in);
        log<char*>(INFO,"Next Hop %s",args_1);
        break;
      case '\x04':
        uVar5 = *(uint *)(buff + iVar10);
        local_1bc = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        (local_218->path_attr).med = local_1bc;
        pcVar8 = "MED %d";
        args_1 = (char **)&local_1bc;
        goto LAB_0011231a;
      case '\x05':
        uVar5 = *(uint *)(buff + iVar10);
        uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_1a8[0] = (char *)CONCAT44(local_1a8[0]._4_4_,uVar5);
        (local_218->path_attr).local_pref = uVar5;
        pcVar8 = "Local Pref %d";
LAB_0011231a:
        log<unsigned_int>(INFO,pcVar8,(uint *)args_1);
        break;
      case '\x06':
        log<>(INFO,"Atomic Aggregate");
        break;
      case '\a':
        if (local_1b8->is_4_octet_as_supported == true) {
          uVar5 = *(uint *)(buff + iVar10);
          iVar10 = iVar10 + 4;
        }
        else {
          uVar5 = (uint)*(ushort *)(buff + iVar10);
          iVar10 = iVar10 + 2;
        }
        local_208 = (char *)CONCAT44(local_208._4_4_,uVar5);
        local_1a8[0] = inet_ntoa((in_addr)*(in_addr_t *)(buff + iVar10));
        log<unsigned_int,char*>(INFO,"Aggregator %d, %s",(uint *)&local_208,args_1);
        break;
      default:
        level = INFO;
        pcVar8 = "Unhandled path attributes type %d";
        args_1 = (char **)(local_21b + 2);
LAB_00112335:
        log<unsigned_char>(level,pcVar8,(uchar *)args_1);
        break;
      case '\x11':
        local_21b[0] = buff[iVar10];
        if (local_21b[0] == '\x02') {
          bVar1 = buff[(long)iVar10 + 1];
          local_200 = 0;
          local_1f8 = '\0';
          local_208 = &local_1f8;
          if ((ulong)bVar1 != 0) {
            uVar11 = 0;
            do {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__cxx11::string::append((char *)&local_208);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8);
              if (local_1e8 != local_1d8) {
                operator_delete(local_1e8,local_1d8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              uVar11 = uVar11 + 1;
            } while (bVar1 != uVar11);
          }
          local_1a8[0] = local_208;
          log<char_const*>(INFO,"AS4 Path%s",local_1a8);
          buff = local_1c8;
          iVar7 = local_210;
          if (local_208 != &local_1f8) goto LAB_001123f4;
        }
        else {
          log<unsigned_char>(DEBUG,"Unable to interpret segment type %d",local_21b);
          iVar7 = local_210;
        }
      }
      iVar10 = iVar10 + (local_20c & 0xffff);
    } while (iVar10 < iVar7);
  }
  return true;
}

Assistant:

bool bgp_update_handle_path_attribute(bgp_peer* peer, const unsigned char* buff, uint16_t unfeasible_routes_length, uint16_t total_path_attribute_length, adj_ribs_in_data& route_data){

    int read_length = 19 + 2 + unfeasible_routes_length + 2;
    while(read_length < 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length){
        uint8_t flag = buff[read_length];
        uint8_t type = buff[read_length + 1];
        read_length += 2;
        uint16_t attribute_len;
        if(!(flag & EXTENDED_LENGTH)){
            attribute_len = buff[read_length];
            read_length += 1;
        }else{
            memcpy(&attribute_len, &buff[read_length], 2);
            attribute_len = ntohs(attribute_len);
            read_length += 2;
        }
        switch(type){
            case ORIGIN:{
                uint8_t origin = buff[read_length];
                route_data.path_attr.origin = origin;
                log(log_level::INFO, "Origin %d", origin);
            }
                break;
            case AS_PATH:{
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    bool is_overflowed = false;
                    for(int i = 0; i < segment_length; i++){
                        std::ostringstream oss;
                        as_list_str.append(" ");
                        if(peer->is_4_octet_as_supported){
                            uint32_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                            asn = ntohl(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }else{
                            uint16_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 2], 2);
                            asn = ntohs(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }
                        as_list_str.append(oss.str());
                    }
                    if(is_overflowed){
                        log(log_level::WARNING, "Overflowed AS PATH %d", segment_length);

                    }
                    log(log_level::INFO, "AS Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            case NEXT_HOP:{
                assert(attribute_len == 4);
                route_data.path_attr.next_hop = buff[read_length]*256*256*256 + buff[read_length + 1]*256*256 + buff[read_length + 2]*256 + buff[read_length + 3];
                log(log_level::INFO, "Next Hop %s", inet_ntoa(in_addr{.s_addr = ntohl(route_data.path_attr.next_hop)}));
            }
                break;
            case MULTI_EXIT_DISC:
                uint32_t med;
                memcpy(&med, &buff[read_length], 4);
                med = ntohl(med);
                route_data.path_attr.med = med;
                log(log_level::INFO, "MED %d", med);
                break;
            case LOCAL_PREF:{
                uint32_t local_pref;
                memcpy(&local_pref, &buff[read_length], 4);
                local_pref = ntohl(local_pref);
                route_data.path_attr.local_pref = local_pref;
                log(log_level::INFO, "Local Pref %d", local_pref);
            }
                break;
            case ATOMIC_AGGREGATE:
                log(log_level::INFO, "Atomic Aggregate");
                break;
            case AGGREGATOR:
            {
                uint32_t asn;
                if(peer->is_4_octet_as_supported){
                    memcpy(&asn, &buff[read_length], 4);
                    read_length += 4;
                }else{
                    uint16_t asn_2;
                    memcpy(&asn_2, &buff[read_length], 2);
                    read_length += 2;
                    asn = asn_2;
                }
                uint32_t address;
                memcpy(&address, &buff[read_length], 4);
                log(log_level::INFO, "Aggregator %d, %s", asn, inet_ntoa(in_addr{.s_addr = address}));
            }
                break;
            case AS4_PATH:
            {
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    for(int i = 0; i < segment_length; i++){
                        uint32_t asn;
                        memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                        asn = ntohl(asn);
                        std::ostringstream oss;
                        oss << asn;
                        as_list_str.append(" ");
                        as_list_str.append(oss.str());
                        /*
                        if(route_data.path_attr.as4_path_length < 64){
                            route_data.path_attr.as4_path[route_data.path_attr.as_path_length++] = asn;
                        }else{
                            log(log_level::WARNING, "Overflowed AS4 PATH %d", segment_length);
                        }*/
                    }
                    log(log_level::INFO, "AS4 Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            default:
                log(log_level::INFO, "Unhandled path attributes type %d", type);
                break;
        }
        read_length += attribute_len;
    }
    return true;
}